

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

double log(double __x)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  LogLevel in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  char local_31;
  string local_30;
  
  to_string_abi_cxx11_(&local_30,in_EDI);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)*in_RSI,in_RSI[1]);
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
  dVar2 = extraout_XMM0_Qa;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void log(LogLevel ll, const std::string& message) {
	std::cout << to_string(ll) << message << '\n';
}